

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

void archive_read_extract_set_skip_file(archive *_a,la_int64_t d,la_int64_t i)

{
  int iVar1;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,0x7fff,"archive_read_extract_set_skip_file");
  if (iVar1 == 0) {
    *(undefined4 *)&_a[1].vtable = 1;
    *(la_int64_t *)&_a[1].archive_format = d;
    _a[1].archive_format_name = (char *)i;
  }
  return;
}

Assistant:

void
archive_read_extract_set_skip_file(struct archive *_a, la_int64_t d,
    la_int64_t i)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_extract_set_skip_file"))
		return;
	a->skip_file_set = 1;
	a->skip_file_dev = d;
	a->skip_file_ino = i;
}